

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::shrink
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *this,size_t newSize)

{
  ulong uVar1;
  
  if (newSize == 0) {
    this->numActive = 0;
    freeIfHeapAllocated(this);
    return;
  }
  uVar1 = this->numActive;
  if (uVar1 < newSize) {
    throwInternalCompilerError("newSize <= numActive","shrink",0xff);
  }
  while (newSize < uVar1) {
    uVar1 = uVar1 - 1;
    this->numActive = uVar1;
  }
  return;
}

Assistant:

void shrink (size_t newSize)
    {
        if (newSize == 0)
            return clear();

        SOUL_ASSERT (newSize <= numActive);

        while (newSize < numActive && numActive > 0)
            items[--numActive].~Item();
    }